

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,string_view configureString)

{
  element_type *peVar1;
  CoreType CVar2;
  bool bVar3;
  int iVar4;
  HelicsException *pHVar5;
  undefined4 extraout_var;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Core> *core;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  shared_ptr<helics::Core> sVar8;
  string_view name;
  string_view message;
  string_view message_00;
  string_view fmt;
  format_args args;
  string newName;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  core = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  pcVar6 = coreName._M_str;
  type_00 = (CoreType)coreName._M_len;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((type_00 == EXTRACT) || (pcVar6 == (char *)0x0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98);
    helics::core::extractCoreType(&local_58,&local_98);
    CVar2 = local_58.first;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_78,&local_58.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
      operator_delete(local_58.second._M_dataplus._M_p,
                      local_58.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar6 == (char *)0x0) && ((char *)local_78._M_string_length != (char *)0x0)) {
      pcVar6 = (char *)local_78._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = CVar2;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar6;
  makeCore(type,name);
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pHVar5 = (HelicsException *)__cxa_allocate_exception(0x28);
    message._M_str = "unable to create core";
    message._M_len = 0x15;
    HelicsException::HelicsException(pHVar5,message);
    *(undefined ***)pHVar5 = &PTR__HelicsException_00560eb0;
    __cxa_throw(pHVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  (*peVar1->_vptr_Core[2])(peVar1,configureString._M_str);
  bVar3 = registerCore(core,type_00);
  if (!bVar3) {
    pHVar5 = (HelicsException *)__cxa_allocate_exception(0x28);
    iVar4 = (*((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Core[0xc])();
    local_98._M_dataplus._M_p = *(pointer *)CONCAT44(extraout_var,iVar4);
    local_98._M_string_length = ((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x23;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_98;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&local_58,(v11 *)"core {} failed to register properly",fmt,args);
    message_00._M_str._4_4_ = local_58._4_4_;
    message_00._M_str._0_4_ = local_58.first;
    message_00._M_len = (size_t)local_58.second._M_dataplus._M_p;
    HelicsException::HelicsException(pHVar5,message_00);
    *(undefined ***)pHVar5 = &PTR__HelicsException_00560eb0;
    __cxa_throw(pHVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
    _Var7._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)core;
  return (shared_ptr<helics::Core>)
         sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    create(CoreType type, std::string_view coreName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    if (!core) {
        throw(helics::RegistrationFailure("unable to create core"));
    }
    core->configure(configureString);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(
            fmt::format("core {} failed to register properly", core->getIdentifier())));
    }

    return core;
}